

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedatabase.cpp
# Opt level: O0

QMimeType __thiscall
QMimeDatabase::mimeTypeForFileNameAndData(QMimeDatabase *this,QString *fileName,QIODevice *device)

{
  bool bVar1;
  QString *in_RCX;
  QMimeDatabasePrivate *in_RDX;
  QString *in_RSI;
  QMimeDatabasePrivate *in_RDI;
  long in_FS_OFFSET;
  QMimeType *result;
  QMutexLocker<QMutex> locker;
  QMutex *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  CaseSensitivity in_stack_ffffffffffffff64;
  QString *in_stack_ffffffffffffff68;
  QExplicitlySharedDataPointer<QMimeTypePrivate> QVar2;
  QIODevice *in_stack_ffffffffffffffa0;
  QMimeDatabasePrivate *this_00;
  QChar local_1a;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  QVar2.d.ptr = (totally_ordered_wrapper<QMimeTypePrivate_*>)
                (totally_ordered_wrapper<QMimeTypePrivate_*>)in_RDI;
  this_00 = in_RDI;
  QMutexLocker<QMutex>::QMutexLocker
            ((QMutexLocker<QMutex> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff58);
  QChar::QChar<char16_t,_true>(&local_1a,L'/');
  bVar1 = QString::endsWith(in_stack_ffffffffffffff68,(QChar)(char16_t)((ulong)QVar2.d.ptr >> 0x30),
                            in_stack_ffffffffffffff64);
  if (bVar1) {
    directoryMimeType();
    QMimeDatabasePrivate::mimeTypeForName(this_00,in_RSI);
    QString::~QString((QString *)0x8e7506);
  }
  else {
    *(undefined1 **)&(in_RDI->m_defaultMimeType).d.d = &DAT_aaaaaaaaaaaaaaaa;
    QMimeDatabasePrivate::mimeTypeForFileNameAndData(in_RDX,in_RCX,in_stack_ffffffffffffffa0);
  }
  QMutexLocker<QMutex>::~QMutexLocker
            ((QMutexLocker<QMutex> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QExplicitlySharedDataPointer<QMimeTypePrivate>)
         (QExplicitlySharedDataPointer<QMimeTypePrivate>)QVar2.d.ptr;
}

Assistant:

QMimeType QMimeDatabase::mimeTypeForFileNameAndData(const QString &fileName, QIODevice *device) const
{
    QMutexLocker locker(&d->mutex);

    if (fileName.endsWith(u'/'))
        return d->mimeTypeForName(directoryMimeType());

    const QMimeType result = d->mimeTypeForFileNameAndData(fileName, device);
    return result;
}